

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

void __thiscall Fl_Preferences::Node::deleteAllEntries(Node *this)

{
  Entry **ppEVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  if (this->entry_ != (Entry *)0x0) {
    ppEVar1 = &this->entry_;
    if (0 < this->nEntry_) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&(*ppEVar1)->name + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&(*ppEVar1)->name + lVar4) = 0;
        }
        pvVar2 = *(void **)((long)&(*ppEVar1)->value + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&(*ppEVar1)->value + lVar4) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < this->nEntry_);
    }
    free(*ppEVar1);
    *ppEVar1 = (Entry *)0x0;
    this->nEntry_ = 0;
    this->NEntry_ = 0;
  }
  this->field_0x30 = this->field_0x30 | 1;
  return;
}

Assistant:

void Fl_Preferences::Node::deleteAllEntries() {
  if ( entry_ ) {
    for ( int i = 0; i < nEntry_; i++ ) {
      if ( entry_[i].name ) {
	free( entry_[i].name );
	entry_[i].name = 0L;
      }
      if ( entry_[i].value ) {
	free( entry_[i].value );
	entry_[i].value = 0L;
      }
    }
    free( entry_ );
    entry_ = 0L;
    nEntry_ = 0;
    NEntry_ = 0;
  }
  dirty_ = 1;
}